

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

char * Assimp::fast_atoreal_move<float>(char *c,float *out,bool check_comma)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint64_t uVar5;
  invalid_argument *this;
  byte *pbVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [16];
  float fVar8;
  byte *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint diff;
  
  bVar2 = *c;
  if ((bVar2 == 0x2d) || (local_50 = (byte *)c, bVar3 = bVar2, bVar2 == 0x2b)) {
    local_50 = (byte *)(c + 1);
    bVar3 = c[1];
  }
  pbVar6 = local_50;
  if ((bVar3 | 0x20) == 0x6e) {
    iVar4 = ASSIMP_strincmp((char *)local_50,"nan",3);
    if (iVar4 == 0) {
      *out = NAN;
      return (char *)(pbVar6 + 3);
    }
    bVar3 = *pbVar6;
  }
  if ((bVar3 | 0x20) == 0x69) {
    iVar4 = ASSIMP_strincmp((char *)pbVar6,"inf",3);
    if (iVar4 == 0) {
      *out = *(float *)(&DAT_001cbaa0 + (ulong)(bVar2 == 0x2d) * 4);
      pbVar1 = pbVar6 + 3;
      if ((pbVar6[3] | 0x20) != 0x69) {
        return (char *)pbVar1;
      }
      iVar4 = ASSIMP_strincmp((char *)pbVar1,"inity",5);
      if (iVar4 != 0) {
        return (char *)pbVar1;
      }
      return (char *)(pbVar6 + 8);
    }
    bVar3 = *pbVar6;
  }
  if ((9 < (byte)(bVar3 - 0x30)) &&
     ((bVar3 != 0x2e && (!check_comma || bVar3 != 0x2c) || (9 < (byte)(pbVar6[1] - 0x30))))) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,
               "Cannot parse string as real number: does not start with digit or decimal point followed by digit."
              );
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_48 = 0.0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  if ((bVar3 != 0x2c || !check_comma) && bVar3 != 0x2e) {
    uVar5 = strtoul10_64((char *)pbVar6,(char **)&local_50,(uint *)0x0);
    local_48 = (float)uVar5;
    bVar3 = *local_50;
    pbVar6 = local_50;
    uStack_44 = extraout_XMM0_Db;
    uStack_40 = extraout_XMM0_Dc;
    uStack_3c = extraout_XMM0_Dd;
  }
  local_50 = pbVar6;
  if (bVar3 == 0x2e || check_comma && bVar3 == 0x2c) {
    pbVar1 = pbVar6 + 1;
    if ((byte)(pbVar6[1] - 0x30) < 10) {
      diff = 0xf;
      local_50 = pbVar1;
      uVar5 = strtoul10_64((char *)pbVar1,(char **)&local_50,&diff);
      auVar7._8_4_ = (int)(uVar5 >> 0x20);
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = 0x45300000;
      local_48 = local_48 +
                 (float)(((auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) *
                        *(double *)(fast_atof_table + (ulong)diff * 8));
    }
    else if (bVar3 == 0x2e) {
      local_50 = pbVar1;
    }
  }
  if ((*local_50 | 0x20) == 0x65) {
    pbVar6 = local_50 + 1;
    bVar3 = local_50[1];
    if ((bVar3 == 0x2d) || (bVar3 == 0x2b)) {
      pbVar6 = local_50 + 2;
    }
    local_50 = pbVar6;
    uVar5 = strtoul10_64((char *)pbVar6,(char **)&local_50,(uint *)0x0);
    fVar8 = (float)uVar5;
    if (bVar3 == 0x2d) {
      fVar8 = -fVar8;
    }
    fVar8 = powf(10.0,fVar8);
    local_48 = local_48 * fVar8;
  }
  if (bVar2 == 0x2d) {
    local_48 = -local_48;
  }
  *out = local_48;
  return (char *)local_50;
}

Assistant:

inline
const char* fast_atoreal_move(const char* c, Real& out, bool check_comma = true) {
    Real f = 0;

    bool inv = (*c == '-');
    if (inv || *c == '+') {
        ++c;
    }

    if ((c[0] == 'N' || c[0] == 'n') && ASSIMP_strincmp(c, "nan", 3) == 0) {
        out = std::numeric_limits<Real>::quiet_NaN();
        c += 3;
        return c;
    }

    if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inf", 3) == 0) {
        out = std::numeric_limits<Real>::infinity();
        if (inv) {
            out = -out;
        }
        c += 3;
        if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inity", 5) == 0) {
            c += 5;
        }
        return c;
     }

    if (!(c[0] >= '0' && c[0] <= '9') &&
            !((c[0] == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9')) {
        throw std::invalid_argument("Cannot parse string "
                                    "as real number: does not start with digit "
                                    "or decimal point followed by digit.");
    }

    if (*c != '.' && (! check_comma || c[0] != ',')) {
        f = static_cast<Real>( strtoul10_64 ( c, &c) );
    }

    if ((*c == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9') {
        ++c;

        // NOTE: The original implementation is highly inaccurate here. The precision of a single
        // IEEE 754 float is not high enough, everything behind the 6th digit tends to be more
        // inaccurate than it would need to be. Casting to double seems to solve the problem.
        // strtol_64 is used to prevent integer overflow.

        // Another fix: this tends to become 0 for long numbers if we don't limit the maximum
        // number of digits to be read. AI_FAST_ATOF_RELAVANT_DECIMALS can be a value between
        // 1 and 15.
        unsigned int diff = AI_FAST_ATOF_RELAVANT_DECIMALS;
        double pl = static_cast<double>( strtoul10_64 ( c, &c, &diff ));

        pl *= fast_atof_table[diff];
        f += static_cast<Real>( pl );
    }
    // For backwards compatibility: eat trailing dots, but not trailing commas.
    else if (*c == '.') {
        ++c;
    }

    // A major 'E' must be allowed. Necessary for proper reading of some DXF files.
    // Thanks to Zhao Lei to point out that this if() must be outside the if (*c == '.' ..)
    if (*c == 'e' || *c == 'E') {
        ++c;
        const bool einv = (*c=='-');
        if (einv || *c=='+') {
            ++c;
        }

        // The reason float constants are used here is that we've seen cases where compilers
        // would perform such casts on compile-time constants at runtime, which would be
        // bad considering how frequently fast_atoreal_move<float> is called in Assimp.
        Real exp = static_cast<Real>( strtoul10_64(c, &c) );
        if (einv) {
            exp = -exp;
        }
        f *= std::pow(static_cast<Real>(10.0), exp);
    }

    if (inv) {
        f = -f;
    }
    out = f;
    return c;
}